

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_swift_struct_init
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool all,bool is_private)

{
  t_type *ttype;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  undefined7 in_register_00000081;
  pointer pptVar6;
  string local_b0;
  string local_90;
  string visibility;
  string local_50;
  
  pcVar4 = "fileprivate";
  if ((this->gen_cocoa_ & 1U) != 0) {
    pcVar4 = "private";
  }
  pcVar5 = "public";
  if ((int)CONCAT71(in_register_00000081,is_private) != 0) {
    pcVar5 = pcVar4;
  }
  std::__cxx11::string::string((string *)&visibility,pcVar5,(allocator *)&local_b0);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,(string *)&visibility);
  std::operator<<(poVar3," init(");
  bVar2 = true;
  for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    if (all) {
LAB_002b24f8:
      if (!bVar2) {
        std::operator<<(out,", ");
      }
      poVar3 = std::operator<<(out,(string *)&(*pptVar6)->name_);
      poVar3 = std::operator<<(poVar3,": ");
      ttype = (*pptVar6)->type_;
      bVar2 = field_is_optional(this,*pptVar6);
      type_name_abi_cxx11_(&local_90,this,ttype,bVar2,false);
      maybe_escape_identifier(&local_b0,this,&local_90);
      std::operator<<(poVar3,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      bVar2 = false;
    }
    else {
      bVar1 = field_is_optional(this,*pptVar6);
      if (!bVar1) goto LAB_002b24f8;
    }
  }
  std::operator<<(out,")");
  block_open(this,out);
  pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (pptVar6 ==
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      block_close(this,out,true);
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&visibility);
      return;
    }
    if (this->gen_cocoa_ == false) {
      if (!all) {
        bVar2 = field_is_optional(this,*pptVar6);
        if (bVar2) goto LAB_002b2749;
      }
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_b0);
      poVar3 = std::operator<<(poVar3,"self.");
      maybe_escape_identifier(&local_90,this,&(*pptVar6)->name_);
      poVar3 = std::operator<<(poVar3,(string *)&local_90);
      poVar3 = std::operator<<(poVar3," = ");
      maybe_escape_identifier(&local_50,this,&(*pptVar6)->name_);
      poVar3 = std::operator<<(poVar3,(string *)&local_50);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
LAB_002b272c:
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else if ((all) || (((*pptVar6)->req_ & ~T_OPT_IN_REQ_OUT) == T_REQUIRED)) {
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_b0);
      poVar3 = std::operator<<(poVar3,"self.");
      maybe_escape_identifier(&local_90,this,&(*pptVar6)->name_);
      poVar3 = std::operator<<(poVar3,(string *)&local_90);
      poVar3 = std::operator<<(poVar3," = ");
      maybe_escape_identifier(&local_50,this,&(*pptVar6)->name_);
      poVar3 = std::operator<<(poVar3,(string *)&local_50);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      goto LAB_002b272c;
    }
LAB_002b2749:
    pptVar6 = pptVar6 + 1;
  } while( true );
}

Assistant:

void t_swift_generator::generate_swift_struct_init(ostream& out,
                                                   t_struct* tstruct,
                                                   bool all,
                                                   bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";

  indent(out) << visibility << " init(";

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  bool first=true;
  for (m_iter = members.begin(); m_iter != members.end();) {
    if (all || !field_is_optional(*m_iter)) {
      if (first) {
        first = false;
      }
      else {
        out << ", ";
      }
      out << (*m_iter)->get_name() << ": "
          << maybe_escape_identifier(type_name((*m_iter)->get_type(), field_is_optional(*m_iter)));
    }
    ++m_iter;
  }
  out << ")";

  block_open(out);

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if (!gen_cocoa_) {
      bool should_set = all;
      should_set = should_set || !field_is_optional((*m_iter));
      if (should_set) {
        out << indent() << "self." << maybe_escape_identifier((*m_iter)->get_name()) << " = "
            << maybe_escape_identifier((*m_iter)->get_name()) << endl;
      }
    } else {
      /** legacy Swift2/Cocoa */
      if (all || (*m_iter)->get_req() == t_field::T_REQUIRED || (*m_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        out << indent() << "self." << maybe_escape_identifier((*m_iter)->get_name()) << " = "
            << maybe_escape_identifier((*m_iter)->get_name()) << endl;
      }
    }
  }

  block_close(out);

  out << endl;
}